

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# okim6258.c
# Opt level: O0

void okim6258_set_clock(void *chip,UINT32 clock)

{
  code *pcVar1;
  undefined8 uVar2;
  UINT32 UVar3;
  okim6258_state *info;
  UINT32 clock_local;
  void *chip_local;
  
  if (clock == 0) {
    *(undefined4 *)((long)chip + 0xc) = *(undefined4 *)((long)chip + 0x2e);
  }
  else {
    *(UINT32 *)((long)chip + 0xc) = clock;
  }
  if (*(long *)((long)chip + 0x40) != 0) {
    pcVar1 = *(code **)((long)chip + 0x40);
    uVar2 = *(undefined8 *)((long)chip + 0x48);
    UVar3 = get_vclk((okim6258_state *)chip);
    (*pcVar1)(uVar2,UVar3);
  }
  return;
}

Assistant:

static void okim6258_set_clock(void *chip, UINT32 clock)
{
	okim6258_state *info = (okim6258_state *)chip;

	if (clock)
	{
		// set to specific value
		info->master_clock = clock;
	}
	else
	{
		// set to value from buffer
		info->master_clock =	(info->clock_buffer[0x00] <<  0) |
								(info->clock_buffer[0x01] <<  8) |
								(info->clock_buffer[0x02] << 16) |
								(info->clock_buffer[0x03] << 24);
	}
	if (info->SmpRateFunc != NULL)
		info->SmpRateFunc(info->SmpRateData, get_vclk(info));
}